

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall dxil_spv::Converter::Impl::get_needs_temp_storage_copy(Impl *this,Value *value)

{
  AllocaInst *pAVar1;
  size_type sVar2;
  Value *local_20;
  Value *value_local;
  Impl *this_local;
  
  local_20 = value;
  value_local = (Value *)this;
  pAVar1 = LLVMBC::dyn_cast<LLVMBC::AllocaInst>(value);
  if (pAVar1 == (AllocaInst *)0x0) {
    this_local._7_1_ = true;
  }
  else {
    sVar2 = std::
            unordered_set<const_LLVMBC::Value_*,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Value_*>_>
            ::count(&this->needs_temp_storage_copy,&local_20);
    this_local._7_1_ = sVar2 != 0;
  }
  return this_local._7_1_;
}

Assistant:

bool Converter::Impl::get_needs_temp_storage_copy(const llvm::Value *value) const
{
	// We always need a temp storage copy if this isn't
	// directly the result of an alloca instruction.
	if (!llvm::dyn_cast<llvm::AllocaInst>(value))
		return true;

	// We'll also need a temp storage copy if this
	// alloca is directly referenced by
	// a TraceRay AND a CallShader.
	return needs_temp_storage_copy.count(value) != 0;
}